

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
pbrt::BasicSceneBuilder::Accelerator
          (BasicSceneBuilder *this,string *name,ParsedParameterVector *params,FileLoc loc)

{
  FileLoc loc_00;
  string *in_RDX;
  ParameterDictionary *in_RSI;
  long in_RDI;
  ParameterDictionary dict;
  ParameterDictionary *in_stack_fffffffffffffda8;
  SceneEntity *pSVar1;
  ParameterDictionary *in_stack_fffffffffffffdb0;
  SceneEntity *this_00;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffdb8;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffdc0;
  SceneEntity *this_01;
  RGBColorSpace *colorSpace;
  ParsedParameterVector *in_stack_fffffffffffffde8;
  ParameterDictionary *in_stack_fffffffffffffdf0;
  RGBColorSpace local_e8;
  ParameterDictionary *local_10;
  
  this_01 = (SceneEntity *)&stack0x00000008;
  colorSpace = &local_e8;
  local_10 = in_RSI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,colorSpace);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&in_stack_fffffffffffffdb0->params);
  if (*(int *)(in_RDI + 0x18) == 1) {
    ErrorExit<char_const(&)[12]>
              ((FileLoc *)in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8,
               (char (*) [12])colorSpace);
  }
  ParameterDictionary::ParameterDictionary(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  pSVar1 = (SceneEntity *)(this_01->name).str;
  this_00 = (SceneEntity *)(this_01->loc).filename._M_len;
  loc_00.filename._M_str = (char *)pSVar1;
  loc_00.filename._M_len = (size_t)colorSpace;
  loc_00._16_8_ = this_00;
  SceneEntity::SceneEntity(this_01,in_RDX,local_10,loc_00);
  SceneEntity::operator=(this_00,pSVar1);
  SceneEntity::~SceneEntity((SceneEntity *)0x51e84b);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x51e855);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x51e862);
  return;
}

Assistant:

void BasicSceneBuilder::Accelerator(const std::string &name, ParsedParameterVector params,
                                    FileLoc loc) {
    ParameterDictionary dict(std::move(params), graphicsState.colorSpace);
    VERIFY_OPTIONS("Accelerator");
    accelerator = SceneEntity(name, std::move(dict), loc);
}